

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audit_regressor.cc
# Opt level: O3

void init_driver(audit_regressor_data *dat)

{
  pointer pcVar1;
  float fVar2;
  options_i *poVar3;
  uint *puVar4;
  _func_int *p_Var5;
  uint32_t uVar6;
  int iVar7;
  int iVar8;
  typed_option<unsigned_int> *ptVar9;
  _Hash_node_base *p_Var10;
  float *pfVar11;
  ostream *poVar12;
  vw_exception *pvVar13;
  size_t sVar14;
  float *pfVar15;
  uint64_t uVar16;
  byte bVar17;
  ulong uVar18;
  vw_ostream *pvVar19;
  vw *pvVar20;
  stringstream __msg;
  undefined1 *local_238 [2];
  undefined1 local_228 [16];
  undefined1 *local_218 [2];
  undefined1 local_208 [16];
  string local_1f8;
  string local_1d8;
  undefined1 local_1b8 [392];
  
  poVar3 = dat->all->options;
  pcVar1 = local_1b8 + 0x10;
  local_1b8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"cache_file","");
  iVar7 = (*poVar3->_vptr_options_i[1])(poVar3,local_1b8);
  if ((char)iVar7 == '\0') {
    poVar3 = dat->all->options;
    local_218[0] = local_208;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"cache","");
    iVar8 = (*poVar3->_vptr_options_i[1])(poVar3,local_218);
    if ((char)iVar8 != '\0') goto LAB_001f6a22;
    bVar17 = 0;
  }
  else {
LAB_001f6a22:
    poVar3 = dat->all->options;
    local_238[0] = local_228;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"kill_cache","");
    iVar8 = (*poVar3->_vptr_options_i[1])(poVar3,local_238);
    if (local_238[0] != local_228) {
      operator_delete(local_238[0]);
    }
    bVar17 = (byte)iVar8 ^ 1;
    if ((char)iVar7 != '\0') goto LAB_001f6a89;
  }
  if (local_218[0] != local_208) {
    operator_delete(local_218[0]);
  }
LAB_001f6a89:
  if ((pointer)local_1b8._0_8_ != pcVar1) {
    operator_delete((void *)local_1b8._0_8_);
  }
  if (bVar17 != 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b8 + 0x10),
               "audit_regressor is incompatible with a cache file.  Use it in single pass mode only."
               ,0x54);
    pvVar13 = (vw_exception *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    VW::vw_exception::vw_exception
              (pvVar13,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/audit_regressor.cc"
               ,0xcf,&local_1d8);
    __cxa_throw(pvVar13,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  dat->all->sd->dump_interval = 1.0;
  dat->all->sd->example_number = 0;
  pvVar20 = dat->all;
  dat->increment = *(ulong *)(pvVar20->l + 0xe0) / *(ulong *)(pvVar20->l + 0xd8);
  dat->total_class_cnt = *(size_t *)(pvVar20->l + 0xd8);
  poVar3 = pvVar20->options;
  local_1b8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"csoaa","");
  iVar7 = (*poVar3->_vptr_options_i[1])(poVar3,local_1b8);
  if ((pointer)local_1b8._0_8_ != pcVar1) {
    operator_delete((void *)local_1b8._0_8_);
  }
  pvVar20 = dat->all;
  if ((char)iVar7 != '\0') {
    poVar3 = pvVar20->options;
    local_1b8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"csoaa","");
    ptVar9 = VW::config::options_i::get_typed_option<unsigned_int>(poVar3,(string *)local_1b8);
    puVar4 = (ptVar9->m_value).super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (puVar4 == (uint *)0x0) {
      uVar18 = 0;
    }
    else {
      uVar18 = (ulong)*puVar4;
    }
    if ((pointer)local_1b8._0_8_ != pcVar1) {
      operator_delete((void *)local_1b8._0_8_);
    }
    pvVar20 = dat->all;
    if (dat->total_class_cnt != uVar18) {
      dat->total_class_cnt = uVar18;
      dat->increment = *(ulong *)(pvVar20->l + 0xe0) / uVar18;
    }
  }
  if ((pvVar20->weights).sparse == true) {
    p_Var10 = (pvVar20->weights).sparse_weights._map._M_h._M_before_begin._M_nxt;
    if (p_Var10 != (_Hash_node_base *)0x0) {
      sVar14 = dat->loaded_regressor_values;
      do {
        fVar2 = *(float *)&(p_Var10[2]._M_nxt)->_M_nxt;
        if ((fVar2 != 0.0) || (NAN(fVar2))) {
          sVar14 = sVar14 + 1;
          dat->loaded_regressor_values = sVar14;
        }
        p_Var10 = p_Var10->_M_nxt;
      } while (p_Var10 != (_Hash_node_base *)0x0);
    }
  }
  else {
    pfVar11 = (pvVar20->weights).dense_weights._begin;
    uVar16 = (pvVar20->weights).dense_weights._weight_mask;
    if (pfVar11 != pfVar11 + uVar16 + 1) {
      uVar6 = (pvVar20->weights).dense_weights._stride_shift;
      pfVar15 = pfVar11;
      do {
        if ((*pfVar11 != 0.0) || (NAN(*pfVar11))) {
          dat->loaded_regressor_values = dat->loaded_regressor_values + 1;
          pfVar15 = (pvVar20->weights).dense_weights._begin;
          uVar16 = (pvVar20->weights).dense_weights._weight_mask;
        }
        pfVar11 = pfVar11 + (1L << ((byte)uVar6 & 0x3f));
      } while (pfVar11 != pfVar15 + uVar16 + 1);
    }
  }
  if (dat->loaded_regressor_values == 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b8 + 0x10),"regressor has no non-zero weights. Nothing to audit.",
               0x34);
    pvVar13 = (vw_exception *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    VW::vw_exception::vw_exception
              (pvVar13,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/audit_regressor.cc"
               ,0xe9,&local_1f8);
    __cxa_throw(pvVar13,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  if (pvVar20->quiet == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              (&(pvVar20->trace_message).super_ostream,"Regressor contains ",0x13);
    poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)&pvVar20->trace_message);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12," values\n",8);
    pvVar20 = dat->all;
    pvVar19 = &pvVar20->trace_message;
    p_Var5 = (pvVar20->trace_message).super_ostream._vptr_basic_ostream[-3];
    *(uint *)(&(pvVar20->trace_message).super_ostream.field_0x18 + (long)p_Var5) =
         *(uint *)(&(pvVar20->trace_message).super_ostream.field_0x18 + (long)p_Var5) & 0xffffff4f |
         0x20;
    *(undefined8 *)
     (&(pvVar20->trace_message).super_ostream.field_0x10 +
     (long)(pvVar20->trace_message).super_ostream._vptr_basic_ostream[-3]) = 0xc;
    std::__ostream_insert<char,std::char_traits<char>>(&pvVar19->super_ostream,"example",7);
    std::__ostream_insert<char,std::char_traits<char>>(&pvVar19->super_ostream," ",1);
    *(undefined8 *)
     (&(pvVar20->trace_message).super_ostream.field_0x10 +
     (long)(pvVar20->trace_message).super_ostream._vptr_basic_ostream[-3]) = 0xe;
    std::__ostream_insert<char,std::char_traits<char>>(&pvVar19->super_ostream,"values",6);
    std::__ostream_insert<char,std::char_traits<char>>(&pvVar19->super_ostream," ",1);
    *(undefined8 *)
     (&(pvVar20->trace_message).super_ostream.field_0x10 +
     (long)(pvVar20->trace_message).super_ostream._vptr_basic_ostream[-3]) = 8;
    std::__ostream_insert<char,std::char_traits<char>>(&pvVar19->super_ostream,"total",5);
    std::ios::widen((char)(pvVar20->trace_message).super_ostream._vptr_basic_ostream[-3] +
                    (char)pvVar19);
    std::ostream::put((char)pvVar19);
    std::ostream::flush();
    pvVar20 = dat->all;
    pvVar19 = &pvVar20->trace_message;
    p_Var5 = (pvVar20->trace_message).super_ostream._vptr_basic_ostream[-3];
    *(uint *)(&(pvVar20->trace_message).super_ostream.field_0x18 + (long)p_Var5) =
         *(uint *)(&(pvVar20->trace_message).super_ostream.field_0x18 + (long)p_Var5) & 0xffffff4f |
         0x20;
    *(undefined8 *)
     (&(pvVar20->trace_message).super_ostream.field_0x10 +
     (long)(pvVar20->trace_message).super_ostream._vptr_basic_ostream[-3]) = 0xc;
    std::__ostream_insert<char,std::char_traits<char>>(&pvVar19->super_ostream,"counter",7);
    std::__ostream_insert<char,std::char_traits<char>>(&pvVar19->super_ostream," ",1);
    *(undefined8 *)
     (&(pvVar20->trace_message).super_ostream.field_0x10 +
     (long)(pvVar20->trace_message).super_ostream._vptr_basic_ostream[-3]) = 0xe;
    std::__ostream_insert<char,std::char_traits<char>>(&pvVar19->super_ostream,"audited",7);
    std::__ostream_insert<char,std::char_traits<char>>(&pvVar19->super_ostream," ",1);
    *(undefined8 *)
     (&(pvVar20->trace_message).super_ostream.field_0x10 +
     (long)(pvVar20->trace_message).super_ostream._vptr_basic_ostream[-3]) = 8;
    std::__ostream_insert<char,std::char_traits<char>>(&pvVar19->super_ostream,"progress",8);
    std::ios::widen((char)(pvVar20->trace_message).super_ostream._vptr_basic_ostream[-3] +
                    (char)pvVar19);
    std::ostream::put((char)pvVar19);
    std::ostream::flush();
  }
  return;
}

Assistant:

void init_driver(audit_regressor_data& dat)
{
  // checks a few settings that might be applied after audit_regressor_setup() is called
  if ((dat.all->options->was_supplied("cache_file") || dat.all->options->was_supplied("cache")) &&
      !dat.all->options->was_supplied("kill_cache"))
  {
    THROW("audit_regressor is incompatible with a cache file.  Use it in single pass mode only.");
  }

  dat.all->sd->dump_interval = 1.;  // regressor could initialize these if saved with --save_resume
  dat.all->sd->example_number = 0;

  dat.increment = dat.all->l->increment / dat.all->l->weights;
  dat.total_class_cnt = dat.all->l->weights;

  if (dat.all->options->was_supplied("csoaa"))
  {
    size_t n = dat.all->options->get_typed_option<uint32_t>("csoaa").value();
    if (n != dat.total_class_cnt)
    {
      dat.total_class_cnt = n;
      dat.increment = dat.all->l->increment / n;
    }
  }

  // count non-null feature values in regressor
  if (dat.all->weights.sparse)
    regressor_values(dat, dat.all->weights.sparse_weights);
  else
    regressor_values(dat, dat.all->weights.dense_weights);

  if (dat.loaded_regressor_values == 0)
    THROW("regressor has no non-zero weights. Nothing to audit.");

  if (!dat.all->quiet)
  {
    dat.all->trace_message << "Regressor contains " << dat.loaded_regressor_values << " values\n";
    dat.all->trace_message << std::left << std::setw(shared_data::col_example_counter) << "example"
                           << " " << std::setw(shared_data::col_example_weight) << "values"
                           << " " << std::setw(shared_data::col_current_label) << "total" << std::endl;
    dat.all->trace_message << std::left << std::setw(shared_data::col_example_counter) << "counter"
                           << " " << std::setw(shared_data::col_example_weight) << "audited"
                           << " " << std::setw(shared_data::col_current_label) << "progress" << std::endl;
  }
}